

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
ValidationCache::ValidationCache
          (ValidationCache *this,size_t script_execution_cache_bytes,size_t signature_cache_bytes)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  ulong uVar3;
  uint *in_R9;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  string_view str;
  string_view logging_function;
  uint256 nonce;
  string log_msg;
  ulong local_120;
  ulong local_118;
  uint32_t local_110 [2];
  long local_108;
  uchar local_f8 [128];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->m_script_execution_cache_hasher);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&this->m_script_execution_cache);
  SignatureCache::SignatureCache(&this->m_signature_cache,signature_cache_bytes);
  local_f8[0x10] = '\0';
  local_f8[0x11] = '\0';
  local_f8[0x12] = '\0';
  local_f8[0x13] = '\0';
  local_f8[0x14] = '\0';
  local_f8[0x15] = '\0';
  local_f8[0x16] = '\0';
  local_f8[0x17] = '\0';
  local_f8[0x18] = '\0';
  local_f8[0x19] = '\0';
  local_f8[0x1a] = '\0';
  local_f8[0x1b] = '\0';
  local_f8[0x1c] = '\0';
  local_f8[0x1d] = '\0';
  local_f8[0x1e] = '\0';
  local_f8[0x1f] = '\0';
  local_f8[0] = '\0';
  local_f8[1] = '\0';
  local_f8[2] = '\0';
  local_f8[3] = '\0';
  local_f8[4] = '\0';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  local_f8[8] = '\0';
  local_f8[9] = '\0';
  local_f8[10] = '\0';
  local_f8[0xb] = '\0';
  local_f8[0xc] = '\0';
  local_f8[0xd] = '\0';
  local_f8[0xe] = '\0';
  local_f8[0xf] = '\0';
  bytes.m_size = 0x20;
  bytes.m_data = local_f8;
  GetRandBytes(bytes);
  CSHA256::Write(&this->m_script_execution_cache_hasher,local_f8,0x20);
  CSHA256::Write(&this->m_script_execution_cache_hasher,local_f8,0x20);
  uVar3 = script_execution_cache_bytes >> 5;
  if (0xfffffffe < uVar3) {
    uVar3 = 0xffffffff;
  }
  local_110[0] = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
                           (&this->m_script_execution_cache,(uint32_t)uVar3);
  local_108 = (ulong)local_110[0] << 5;
  local_118 = (ulong)(local_110[0] >> 0xf);
  local_120 = script_execution_cache_bytes >> 0x14;
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar2);
  if (bVar1) {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    tinyformat::format<unsigned_long,unsigned_long,unsigned_int>
              (&local_78,
               (tinyformat *)
               "Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n"
               ,(char *)&local_118,&local_120,(unsigned_long *)local_110,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pLVar2 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x57;
    local_78._M_string_length = 0x84a7d9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    str._M_str = local_58._M_dataplus._M_p;
    str._M_len = local_58._M_string_length;
    logging_function._M_str = "ValidationCache";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x83f,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationCache::ValidationCache(const size_t script_execution_cache_bytes, const size_t signature_cache_bytes)
    : m_signature_cache{signature_cache_bytes}
{
    // Setup the salted hasher
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy twice to fill the 64 bytes.
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);

    const auto [num_elems, approx_size_bytes] = m_script_execution_cache.setup_bytes(script_execution_cache_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n",
              approx_size_bytes >> 20, script_execution_cache_bytes >> 20, num_elems);
}